

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ecdsa_s2c_sign
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *signature,
              secp256k1_ecdsa_s2c_opening *s2c_opening,uchar *msg32,uchar *seckey,uchar *s2c_data32)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  uchar ndata [32];
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_sha256 s2c_sha;
  
  if ((ctx->ecmult_gen_ctx).built == 0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  else if (msg32 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "msg32 != NULL";
  }
  else if (signature == (secp256k1_ecdsa_signature *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "signature != NULL";
  }
  else if (seckey == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "seckey != NULL";
  }
  else {
    if (s2c_data32 != (uchar *)0x0) {
      secp256k1_s2c_ecdsa_data_sha256_tagged(&s2c_sha);
      secp256k1_sha256_write(&s2c_sha,s2c_data32,0x20);
      secp256k1_sha256_finalize(&s2c_sha,ndata);
      secp256k1_s2c_ecdsa_point_sha256_tagged(&s2c_sha);
      iVar1 = secp256k1_ecdsa_sign_inner
                        (ctx,&r,&s,(int *)0x0,&s2c_sha,s2c_opening,s2c_data32,msg32,seckey,
                         (secp256k1_nonce_function)0x0,ndata);
      secp256k1_scalar_cmov(&r,&secp256k1_scalar_zero,(uint)(iVar1 == 0));
      secp256k1_scalar_cmov(&s,&secp256k1_scalar_zero,(uint)(iVar1 == 0));
      *(uint64_t *)(signature->data + 0x10) = r.d[2];
      *(uint64_t *)(signature->data + 0x18) = r.d[3];
      *(uint64_t *)signature->data = r.d[0];
      *(uint64_t *)(signature->data + 8) = r.d[1];
      *(uint64_t *)(signature->data + 0x20) = s.d[0];
      *(uint64_t *)(signature->data + 0x28) = s.d[1];
      *(uint64_t *)(signature->data + 0x30) = s.d[2];
      *(uint64_t *)(signature->data + 0x38) = s.d[3];
      return iVar1;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "s2c_data32 != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_ecdsa_s2c_sign(const secp256k1_context* ctx, secp256k1_ecdsa_signature* signature, secp256k1_ecdsa_s2c_opening* s2c_opening, const unsigned char
 *msg32, const unsigned char *seckey, const unsigned char* s2c_data32) {
    secp256k1_scalar r, s;
    int ret;
    unsigned char ndata[32];
    secp256k1_sha256 s2c_sha;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(s2c_data32 != NULL);

    /* Provide `s2c_data32` to the nonce function as additional data to
     * derive the nonce. It is first hashed because it should be possible
     * to derive nonces even if only a SHA256 commitment to the data is
     * known.  This is important in the ECDSA anti-exfil protocol. */
    secp256k1_s2c_ecdsa_data_sha256_tagged(&s2c_sha);
    secp256k1_sha256_write(&s2c_sha, s2c_data32, 32);
    secp256k1_sha256_finalize(&s2c_sha, ndata);

    secp256k1_s2c_ecdsa_point_sha256_tagged(&s2c_sha);
    ret = secp256k1_ecdsa_sign_inner(ctx, &r, &s, NULL, &s2c_sha, s2c_opening, s2c_data32, msg32, seckey, NULL, ndata);
    secp256k1_scalar_cmov(&r, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_zero, !ret);
    secp256k1_ecdsa_signature_save(signature, &r, &s);
    return ret;
}